

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::coap::Message::GetOption
          (Error *__return_storage_ptr__,Message *this,ByteArray *aValue,OptionType aNumber)

{
  _Base_ptr p_Var1;
  char *pcVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar5;
  format_args args;
  string_view fmt;
  OptionType local_a2;
  string local_a0;
  ErrorCode local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  format_string_checker<char> local_58;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  p_Var3 = &(this->mOptions)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var3->_M_header;
  for (; p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[bVar5]) {
    bVar5 = (OptionType)p_Var1[1]._M_color < aNumber;
    if (!bVar5) {
      p_Var4 = p_Var1;
    }
  }
  p_Var1 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var3) &&
     (p_Var1 = p_Var4, aNumber < (OptionType)p_Var4[1]._M_color)) {
    p_Var1 = &p_Var3->_M_header;
  }
  local_a2 = aNumber;
  if ((_Rb_tree_header *)p_Var1 == p_Var3) {
    local_58.types_[0] = custom_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "CoAP option {} not found";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x18;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_58.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<ot::commissioner::coap::OptionType,fmt::v10::detail::compile_parse_context<char>>
    ;
    begin = "CoAP option {} not found";
    local_58.context_.types_ = local_58.types_;
    do {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,ot::commissioner::coap::OptionType>&>
                           (begin,"",&local_58);
      }
      begin = pcVar2;
    } while (pcVar2 != "");
    local_58._0_8_ = &local_a2;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                 ::
                 format_custom_arg<ot::commissioner::coap::OptionType,fmt::v10::formatter<ot::commissioner::coap::OptionType,char,void>>
    ;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    fmt.size_ = 0xf;
    fmt.data_ = (char *)0x18;
    ::fmt::v10::vformat_abi_cxx11_(&local_a0,(v10 *)"CoAP option {} not found",fmt,args);
    local_80 = kNotFound;
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_a0._M_dataplus._M_p,
               local_a0._M_dataplus._M_p + local_a0._M_string_length);
    __return_storage_ptr__->mCode = local_80;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (aValue,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var1[1]._M_parent)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::GetOption(ByteArray &aValue, OptionType aNumber) const
{
    Error error;
    auto  option = GetOption(aNumber);

    VerifyOrExit(option != nullptr, error = ERROR_NOT_FOUND("CoAP option {} not found", aNumber));

    aValue = option->GetOpaqueValue();

exit:
    return error;
}